

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcBlendEquationAdvancedTests.cpp
# Opt level: O1

Vec4 __thiscall glcts::BlendDifference(glcts *this,Vec4 *src,Vec4 *dst)

{
  uint uVar1;
  float fVar2;
  float fVar3;
  Vec4 VVar4;
  Vec4 rgb;
  Vec4 local_18;
  
  fVar2 = src->m_data[0] - dst->m_data[0];
  uVar1 = -(uint)(-fVar2 <= fVar2);
  local_18.m_data[0] = (float)(~uVar1 & (uint)-fVar2 | (uint)fVar2 & uVar1);
  fVar3 = src->m_data[1] - dst->m_data[1];
  uVar1 = -(uint)(-fVar3 <= fVar3);
  fVar2 = src->m_data[2] - dst->m_data[2];
  local_18.m_data[1] = (float)(~uVar1 & (uint)-fVar3 | (uint)fVar3 & uVar1);
  uVar1 = -(uint)(-fVar2 <= fVar2);
  local_18.m_data[2] = (float)(~uVar1 & (uint)-fVar2 | (uint)fVar2 & uVar1);
  local_18.m_data[3] = 0.0;
  VVar4 = Blend(this,&local_18,src,dst);
  return (Vec4)VVar4.m_data;
}

Assistant:

static tcu::Vec4 BlendDifference(const tcu::Vec4& src, const tcu::Vec4& dst)
{
	tcu::Vec4 rgb(deFloatAbs(src[0] - dst[0]), deFloatAbs(src[1] - dst[1]), deFloatAbs(src[2] - dst[2]), 0.f);

	return Blend(rgb, src, dst);
}